

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * __thiscall Pathie::Path::root(Path *__return_storage_ptr__,Path *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"/",&local_31);
  Path(__return_storage_ptr__,&local_30);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

Path Path::root() const
{
#if defined(_PATHIE_UNIX)
  return Path("/");
#elif defined(_WIN32)
  // Check if we have an absolute path with drive,
  // otherwise return the root for the current drive.
  if (m_path[1] == ':') // Colon is on Windows only allowed here to denote a preceeding drive letter => absolute path
    return Path(m_path.substr(0, 3));
  else
    return Path("/");
#else
#error Unsupported system.
#endif
}